

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O1

double __thiscall chrono::ChFunction_Sequence::Get_y_dx(ChFunction_Sequence *this,double x)

{
  _List_node_base *p_Var1;
  undefined1 auVar2 [16];
  _List_node_base *p_Var3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  
  p_Var3 = (this->functions).
           super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>._M_impl._M_node
           .super__List_node_base._M_next;
  if (p_Var3 == (_List_node_base *)&this->functions) {
    dVar4 = 0.0;
  }
  else {
    auVar6 = ZEXT864(0);
    do {
      p_Var1 = p_Var3[3]._M_next;
      if (((double)p_Var1 <= x) && (x < (double)p_Var3[3]._M_prev)) {
        dVar4 = (double)(**(code **)((long)(p_Var3[1]._M_next)->_M_next + 0x28))();
        auVar7._8_8_ = 0;
        auVar7._0_8_ = x - (double)p_Var1;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = p_Var3[5]._M_next;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = dVar4 + (double)p_Var3[4]._M_prev;
        auVar2 = vfmadd231sd_fma(auVar5,auVar7,auVar2);
        auVar6 = ZEXT1664(auVar2);
      }
      dVar4 = auVar6._0_8_;
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)&this->functions);
  }
  return dVar4;
}

Assistant:

double ChFunction_Sequence::Get_y_dx(double x) const {
    double res = 0;
    double localtime;
    for (auto iter = functions.begin(); iter != functions.end(); ++iter) {
        if ((x >= iter->t_start) && (x < iter->t_end)) {
            localtime = x - iter->t_start;
            res = iter->fx->Get_y_dx(localtime) + iter->Iydt + iter->Iydtdt * localtime;
        }
    }
    return res;
}